

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseUnion
          (StructTranslator *this,Reader *decl,Reader members,MemberInfo *parent,Union *layout,
          uint *codeOrder)

{
  Arena *this_00;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> **pppMVar1;
  short sVar2;
  uint uVar3;
  void *pvVar4;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar5;
  Reader parent_00;
  Reader parent_01;
  Reader members_00;
  Reader members_01;
  Reader decl_00;
  Reader decl_01;
  Group *pGVar6;
  MemberInfo *pMVar7;
  Union *layout_00;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ElementCount index;
  ElementCount EVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Reader RVar16;
  uint subCodeOrder;
  Reader member;
  bool local_1e4 [4];
  MemberInfo *local_1e0;
  StructReader local_1d8;
  PointerReader local_1a8;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_180;
  Union *local_178;
  uint *local_170;
  ElementCount local_164;
  StructBuilder *local_160;
  NodeSourceInfoBuilderPair local_158;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_100;
  Group *local_f8;
  ListReader local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ListReader local_90;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1e0 = parent;
  local_178 = layout;
  local_170 = codeOrder;
  if (members.reader.elementCount < 2) {
    uVar3 = (decl->_reader).dataSize;
    uVar9 = 0;
    if (uVar3 < 0x40) {
      uVar10 = 0;
    }
    else {
      pvVar4 = (decl->_reader).data;
      uVar10 = (ulong)*(uint *)((long)pvVar4 + 4);
      if (0x5f < uVar3) {
        uVar9 = (ulong)*(uint *)((long)pvVar4 + 8);
      }
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar10,uVar9,"Union must have at least two members.",0x26);
    if (members.reader.elementCount == 0) {
      return;
    }
  }
  this_00 = &this->arena;
  local_160 = &(local_1e0->node)._builder;
  local_180 = &this->allMembers;
  local_100 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
               *)&this->membersByOrdinal;
  index = 0;
  local_164 = members.reader.elementCount;
  EVar12 = members.reader.elementCount;
  do {
    capnp::_::ListReader::getStructElement(&local_1d8,&members.reader,index);
    pMVar7 = local_1e0;
    if (0x1f < local_1d8.dataSize) {
      sVar2 = *(short *)((long)local_1d8.data + 2);
      if (sVar2 == 8) {
        local_1e0->childCount = local_1e0->childCount + 1;
        pGVar6 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_178);
        local_1a8.segment._0_4_ = *local_170;
        *local_170 = (uint)local_1a8.segment + 1;
        capnp::_::StructBuilder::asReader(local_160);
        decl_01._reader.segment._4_4_ = local_1d8.segment._4_4_;
        decl_01._reader.segment._0_4_ = (uint)local_1d8.segment;
        decl_01._reader.capTable._4_4_ = local_1d8.capTable._4_4_;
        decl_01._reader.capTable._0_4_ = local_1d8.capTable._0_4_;
        decl_01._reader.pointerCount = local_1d8.pointerCount;
        decl_01._reader.dataSize = local_1d8.dataSize;
        decl_01._reader._38_2_ = local_1d8._38_2_;
        decl_01._reader._44_4_ = local_1d8._44_4_;
        decl_01._reader.nestingLimit = local_1d8.nestingLimit;
        parent_01._reader.capTable = (CapTableReader *)uStack_b8;
        parent_01._reader.segment = (SegmentReader *)local_c0;
        parent_01._reader.data = (void *)local_b0;
        parent_01._reader.pointers = (WirePointer *)uStack_a8;
        parent_01._reader.dataSize = (undefined4)local_a0;
        parent_01._reader.pointerCount = local_a0._4_2_;
        parent_01._reader._38_2_ = local_a0._6_2_;
        parent_01._reader._40_8_ = uStack_98;
        decl_01._reader.data = local_1d8.data;
        decl_01._reader.pointers = local_1d8.pointers;
        newGroupNode(&local_158,this,parent_01,decl_01);
        local_1e4[0] = true;
        local_f8 = pGVar6;
        pMVar7 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                           (this_00,local_1e0,(uint *)&local_1a8,(Reader *)&local_1d8,&local_158,
                            local_1e4);
        ppMVar8 = (this->allMembers).builder.pos;
        if (ppMVar8 == (this->allMembers).builder.endPtr) {
          ppMVar5 = (this->allMembers).builder.ptr;
          sVar11 = (long)ppMVar8 - (long)ppMVar5 >> 2;
          if (ppMVar8 == ppMVar5) {
            sVar11 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                    (local_180,sVar11);
          ppMVar8 = (this->allMembers).builder.pos;
        }
        EVar12 = local_164;
        *ppMVar8 = pMVar7;
        pppMVar1 = &(this->allMembers).builder.pos;
        *pppMVar1 = *pppMVar1 + 1;
        local_158.node._builder.data = local_1d8.pointers + 2;
        local_158.node._builder.segment._0_4_ = (uint)local_1d8.segment;
        local_158.node._builder.segment._4_4_ = local_1d8.segment._4_4_;
        uVar14 = local_1d8.capTable._0_4_;
        uVar15 = local_1d8.capTable._4_4_;
        local_158.node._builder.pointers._0_4_ = local_1d8.nestingLimit;
        if (local_1d8.pointerCount < 3) {
          local_158.node._builder.data = (WirePointer *)0x0;
          local_158.node._builder.pointers._0_4_ = 0x7fffffff;
          local_158.node._builder.segment._0_4_ = 0;
          local_158.node._builder.segment._4_4_ = 0;
          uVar14 = 0;
          uVar15 = 0;
        }
        local_158.node._builder.capTable = (CapTableBuilder *)CONCAT44(uVar15,uVar14);
        capnp::_::PointerReader::getList
                  (&local_f0,(PointerReader *)&local_158,INLINE_COMPOSITE,(word *)0x0);
        members_00.reader.capTable = local_f0.capTable;
        members_00.reader.segment = local_f0.segment;
        members_00.reader.ptr = local_f0.ptr;
        members_00.reader.elementCount = local_f0.elementCount;
        members_00.reader.step = local_f0.step;
        members_00.reader.structDataSize = local_f0.structDataSize;
        members_00.reader.structPointerCount = local_f0.structPointerCount;
        members_00.reader.elementSize = local_f0.elementSize;
        members_00.reader._39_1_ = local_f0._39_1_;
        members_00.reader.nestingLimit = local_f0.nestingLimit;
        members_00.reader._44_4_ = local_f0._44_4_;
        traverseGroup(this,members_00,pMVar7,&local_f8->super_StructOrGroup);
      }
      else if (sVar2 == 7) {
        bVar13 = local_1d8.pointerCount == 0;
        local_1a8.pointer = local_1d8.pointers;
        if (bVar13) {
          local_1a8.pointer = (WirePointer *)0x0;
        }
        local_1a8.nestingLimit = local_1d8.nestingLimit;
        if (bVar13) {
          local_1a8.nestingLimit = 0x7fffffff;
        }
        local_1a8.segment._0_4_ = 0;
        local_1a8.segment._4_4_ = 0;
        local_1a8.capTable._0_4_ = 0;
        local_1a8.capTable._4_4_ = 0;
        if (!bVar13) {
          local_1a8.segment._0_4_ = (uint)local_1d8.segment;
          local_1a8.segment._4_4_ = local_1d8.segment._4_4_;
          local_1a8.capTable._0_4_ = local_1d8.capTable._0_4_;
          local_1a8.capTable._4_4_ = local_1d8.capTable._4_4_;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&local_158,&local_1a8,(word *)0x0);
        local_1a8.pointer = (WirePointer *)0x0;
        local_1a8.nestingLimit = 0x7fffffff;
        if (local_158.node._builder.pointerCount != 0) {
          local_1a8.pointer =
               (WirePointer *)
               CONCAT44(local_158.node._builder.pointers._4_4_,(int)local_158.node._builder.pointers
                       );
          local_1a8.nestingLimit = (int)local_158.sourceInfo._builder.segment;
        }
        local_1a8.segment._0_4_ = 0;
        local_1a8.segment._4_4_ = 0;
        local_1a8.capTable._0_4_ = 0;
        local_1a8.capTable._4_4_ = 0;
        if (local_158.node._builder.pointerCount != 0) {
          local_1a8.segment._0_4_ = (uint)local_158.node._builder.segment;
          local_1a8.segment._4_4_ = local_158.node._builder.segment._4_4_;
          local_1a8.capTable._0_4_ = local_158.node._builder.capTable._0_4_;
          local_1a8.capTable._4_4_ = local_158.node._builder.capTable._4_4_;
        }
        RVar16 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1a8,(void *)0x0,0);
        if ((RVar16.super_StringPtr.content.size_ == 1) &&
           (*RVar16.super_StringPtr.content.ptr == '\0')) {
          uVar9 = 0;
          if (local_1d8.dataSize < 0x40) {
            uVar10 = 0;
          }
          else {
            uVar10 = (ulong)*(uint *)((long)local_1d8.data + 4);
            if (0x5f < local_1d8.dataSize) {
              uVar9 = (ulong)*(uint *)((long)local_1d8.data + 8);
            }
          }
          (**this->errorReporter->_vptr_ErrorReporter)
                    (this->errorReporter,uVar10,uVar9,"Unions cannot contain unnamed unions.",0x26);
        }
        else {
          local_1e0->childCount = local_1e0->childCount + 1;
          pGVar6 = kj::Arena::
                   allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                             (this_00,local_178);
          layout_00 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
                                (this_00,pGVar6);
          local_1a8.segment._0_4_ = *local_170;
          *local_170 = (uint)local_1a8.segment + 1;
          capnp::_::StructBuilder::asReader(local_160);
          decl_00._reader.segment._4_4_ = local_1d8.segment._4_4_;
          decl_00._reader.segment._0_4_ = (uint)local_1d8.segment;
          decl_00._reader.capTable._4_4_ = local_1d8.capTable._4_4_;
          decl_00._reader.capTable._0_4_ = local_1d8.capTable._0_4_;
          decl_00._reader.pointerCount = local_1d8.pointerCount;
          decl_00._reader.dataSize = local_1d8.dataSize;
          decl_00._reader._38_2_ = local_1d8._38_2_;
          decl_00._reader._44_4_ = local_1d8._44_4_;
          decl_00._reader.nestingLimit = local_1d8.nestingLimit;
          parent_00._reader.capTable = (CapTableReader *)uStack_58;
          parent_00._reader.segment = (SegmentReader *)local_60;
          parent_00._reader.data = (void *)local_50;
          parent_00._reader.pointers = (WirePointer *)uStack_48;
          parent_00._reader.dataSize = (undefined4)local_40;
          parent_00._reader.pointerCount = local_40._4_2_;
          parent_00._reader._38_2_ = local_40._6_2_;
          parent_00._reader._40_8_ = uStack_38;
          decl_00._reader.data = local_1d8.data;
          decl_00._reader.pointers = local_1d8.pointers;
          newGroupNode(&local_158,this,parent_00,decl_00);
          local_1e4[0] = true;
          pMVar7 = kj::Arena::
                   allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                             (this_00,local_1e0,(uint *)&local_1a8,(Reader *)&local_1d8,&local_158,
                              local_1e4);
          ppMVar8 = (this->allMembers).builder.pos;
          if (ppMVar8 == (this->allMembers).builder.endPtr) {
            ppMVar5 = (this->allMembers).builder.ptr;
            sVar11 = (long)ppMVar8 - (long)ppMVar5 >> 2;
            if (ppMVar8 == ppMVar5) {
              sVar11 = 4;
            }
            kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                      (local_180,sVar11);
            ppMVar8 = (this->allMembers).builder.pos;
          }
          *ppMVar8 = pMVar7;
          pppMVar1 = &(this->allMembers).builder.pos;
          *pppMVar1 = *pppMVar1 + 1;
          (pMVar7->field_21).unionScope = layout_00;
          local_158.node._builder.data = local_1d8.pointers + 2;
          if (local_1d8.pointerCount < 3) {
            local_158.node._builder.data = (WirePointer *)0x0;
          }
          local_1e4[0] = false;
          local_1e4[1] = false;
          local_1e4[2] = false;
          local_1e4[3] = false;
          local_158.node._builder.segment._0_4_ = (uint)local_1d8.segment;
          local_158.node._builder.segment._4_4_ = local_1d8.segment._4_4_;
          uVar14 = local_1d8.capTable._0_4_;
          uVar15 = local_1d8.capTable._4_4_;
          local_158.node._builder.pointers._0_4_ = local_1d8.nestingLimit;
          if (local_1d8.pointerCount < 3) {
            local_158.node._builder.segment._0_4_ = 0;
            local_158.node._builder.segment._4_4_ = 0;
            uVar14 = 0;
            uVar15 = 0;
            local_158.node._builder.pointers._0_4_ = 0x7fffffff;
          }
          local_158.node._builder.capTable = (CapTableBuilder *)CONCAT44(uVar15,uVar14);
          capnp::_::PointerReader::getList
                    (&local_90,(PointerReader *)&local_158,INLINE_COMPOSITE,(word *)0x0);
          members_01.reader.capTable = local_90.capTable;
          members_01.reader.segment = local_90.segment;
          members_01.reader.ptr = local_90.ptr;
          members_01.reader.elementCount = local_90.elementCount;
          members_01.reader.step = local_90.step;
          members_01.reader.structDataSize = local_90.structDataSize;
          members_01.reader.structPointerCount = local_90.structPointerCount;
          members_01.reader.elementSize = local_90.elementSize;
          members_01.reader._39_1_ = local_90._39_1_;
          members_01.reader.nestingLimit = local_90.nestingLimit;
          members_01.reader._44_4_ = local_90._44_4_;
          traverseUnion(this,(Reader *)&local_1d8,members_01,pMVar7,layout_00,(uint *)local_1e4);
          if ((0xf < local_1d8.dataSize) && (*local_1d8.data == 2)) {
            local_1a8.pointer = local_1d8.pointers + 1;
            local_1a8.segment._0_4_ = (uint)local_1d8.segment;
            local_1a8.segment._4_4_ = local_1d8.segment._4_4_;
            local_1a8.capTable._0_4_ = local_1d8.capTable._0_4_;
            local_1a8.capTable._4_4_ = local_1d8.capTable._4_4_;
            local_1a8.nestingLimit = local_1d8.nestingLimit;
            if (local_1d8.pointerCount < 2) {
              local_1a8.pointer = (WirePointer *)0x0;
              local_1a8.segment._0_4_ = 0;
              local_1a8.segment._4_4_ = 0;
              local_1a8.capTable._0_4_ = 0;
              local_1a8.capTable._4_4_ = 0;
              local_1a8.nestingLimit = 0x7fffffff;
            }
            capnp::_::PointerReader::getStruct((StructReader *)&local_158,&local_1a8,(word *)0x0);
            goto LAB_003cf73b;
          }
        }
      }
      else if (sVar2 == 6) {
        local_1e0->childCount = local_1e0->childCount + 1;
        pGVar6 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_178);
        local_158.node._builder.segment._0_4_ = *local_170;
        *local_170 = (uint)local_158.node._builder.segment + 1;
        local_1a8.segment._0_4_ = CONCAT31(local_1a8.segment._1_3_,1);
        pMVar7 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::Group&,bool>
                           (this_00,pMVar7,(uint *)&local_158,(Reader *)&local_1d8,pGVar6,
                            (bool *)&local_1a8);
        ppMVar8 = (this->allMembers).builder.pos;
        if (ppMVar8 == (this->allMembers).builder.endPtr) {
          ppMVar5 = (this->allMembers).builder.ptr;
          sVar11 = (long)ppMVar8 - (long)ppMVar5 >> 2;
          if (ppMVar8 == ppMVar5) {
            sVar11 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                    (local_180,sVar11);
          ppMVar8 = (this->allMembers).builder.pos;
        }
        *ppMVar8 = pMVar7;
        pppMVar1 = &(this->allMembers).builder.pos;
        *pppMVar1 = *pppMVar1 + 1;
        local_1a8.pointer = local_1d8.pointers + 1;
        local_1a8.segment._0_4_ = (uint)local_1d8.segment;
        local_1a8.segment._4_4_ = local_1d8.segment._4_4_;
        local_1a8.capTable._0_4_ = local_1d8.capTable._0_4_;
        local_1a8.capTable._4_4_ = local_1d8.capTable._4_4_;
        local_1a8.nestingLimit = local_1d8.nestingLimit;
        if (local_1d8.pointerCount < 2) {
          local_1a8.segment._0_4_ = 0;
          local_1a8.segment._4_4_ = 0;
          local_1a8.capTable._0_4_ = 0;
          local_1a8.capTable._4_4_ = 0;
          local_1a8.nestingLimit = 0x7fffffff;
          local_1a8.pointer = (WirePointer *)0x0;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&local_158,&local_1a8,(word *)0x0);
LAB_003cf73b:
        local_158.node._builder.segment._0_4_ = 0;
        if (0x3f < local_158.node._builder.dataSize) {
          local_158.node._builder.segment._0_4_ =
               ((WireValue<uint32_t>_conflict *)local_158.node._builder.data)->value;
        }
        local_158.node._builder.capTable = (CapTableBuilder *)pMVar7;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
        ::
        _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                  (local_100,
                   (pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
                    *)&local_158);
      }
    }
    index = index + 1;
    if (EVar12 == index) {
      return;
    }
  } while( true );
}

Assistant:

void traverseUnion(const Declaration::Reader& decl,
                     List<Declaration>::Reader members, MemberInfo& parent,
                     StructLayout::Union& layout, uint& codeOrder) {
    if (members.size() < 2) {
      errorReporter.addErrorOn(decl, "Union must have at least two members.");
    }

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          // For layout purposes, pretend this field is enclosed in a one-member group.
          StructLayout::Group& singletonGroup =
              arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(parent, codeOrder++, member, singletonGroup,
                                                   true);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION:
          if (member.getName().getValue() == "") {
            errorReporter.addErrorOn(member, "Unions cannot contain unnamed unions.");
          } else {
            parent.childCount++;

            // For layout purposes, pretend this union is enclosed in a one-member group.
            StructLayout::Group& singletonGroup =
                arena.allocate<StructLayout::Group>(layout);
            StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(singletonGroup);

            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                true);
            allMembers.add(memberInfo);
            memberInfo->unionScope = &unionLayout;
            uint subCodeOrder = 0;
            traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, subCodeOrder);
            if (member.getId().isOrdinal()) {
              ordinal = member.getId().getOrdinal().getValue();
            }
          }
          break;

        case Declaration::GROUP: {
          parent.childCount++;
          StructLayout::Group& group = arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              true);
          allMembers.add(memberInfo);
          traverseGroup(member.getNestedDecls(), *memberInfo, group);
          break;
        }

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }